

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O0

HTS_Boolean HTS_get_token_from_fp_with_separator(HTS_File *fp,char *buff,char separator)

{
  int iVar1;
  uchar in_DL;
  long in_RSI;
  long in_RDI;
  size_t i;
  char c;
  HTS_File *in_stack_ffffffffffffffd8;
  HTS_File *pHVar2;
  HTS_File *fp_00;
  uchar local_1a;
  
  if ((in_RDI == 0) || (iVar1 = HTS_feof(in_stack_ffffffffffffffd8), iVar1 != 0)) {
    return '\0';
  }
  iVar1 = HTS_fgetc(in_stack_ffffffffffffffd8);
  local_1a = (uchar)iVar1;
  while (local_1a == in_DL) {
    iVar1 = HTS_feof(in_stack_ffffffffffffffd8);
    if (iVar1 != 0) {
      return '\0';
    }
    iVar1 = HTS_fgetc(in_stack_ffffffffffffffd8);
    local_1a = (uchar)iVar1;
    if (local_1a == 0xff) {
      return '\0';
    }
  }
  pHVar2 = (HTS_File *)0x0;
  do {
    fp_00 = pHVar2;
    if (local_1a == in_DL) break;
    fp_00 = (HTS_File *)&pHVar2->field_0x1;
    (&pHVar2->type)[in_RSI] = local_1a;
    iVar1 = HTS_feof(fp_00);
    if (iVar1 != 0) break;
    iVar1 = HTS_fgetc(fp_00);
    local_1a = (uchar)iVar1;
    pHVar2 = fp_00;
  } while (local_1a != 0xff);
  (&fp_00->type)[in_RSI] = '\0';
  return '\x01';
}

Assistant:

HTS_Boolean HTS_get_token_from_fp_with_separator(HTS_File * fp, char *buff, char separator)
{
   char c;
   size_t i;

   if (fp == NULL || HTS_feof(fp))
      return FALSE;
   c = HTS_fgetc(fp);
   while (c == separator) {
      if (HTS_feof(fp))
         return FALSE;
      c = HTS_fgetc(fp);
      if (c == EOF)
         return FALSE;
   }

   for (i = 0; c != separator;) {
      buff[i++] = c;
      if (HTS_feof(fp))
         break;
      c = HTS_fgetc(fp);
      if (c == EOF)
         break;
   }

   buff[i] = '\0';
   return TRUE;
}